

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexBot.cpp
# Opt level: O0

void __thiscall tiger::trains::ai::ComplexBot::ComplexBot(ComplexBot *this)

{
  IBot *in_RDI;
  BotSharedData *unaff_retaddr;
  
  IBot::IBot(in_RDI);
  in_RDI->_vptr_IBot = (_func_int **)&PTR__ComplexBot_002d3fd0;
  std::vector<tiger::trains::ai::ISubBot_*,_std::allocator<tiger::trains::ai::ISubBot_*>_>::vector
            ((vector<tiger::trains::ai::ISubBot_*,_std::allocator<tiger::trains::ai::ISubBot_*>_> *)
             0x2591d4);
  BotSharedData::BotSharedData(unaff_retaddr);
  return;
}

Assistant:

ComplexBot::ComplexBot()
{
}